

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

bool fmt::v7::detail::dragonbox::cache_accessor<float>::compute_mul_parity
               (carrier_uint two_f,cache_entry_type *cache,int beta_minus_1)

{
  if (beta_minus_1 < 1) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x73a,"");
  }
  if ((uint)beta_minus_1 < 0x40) {
    return ((ulong)two_f * *cache >> ((ulong)(byte)(0x40 - (char)beta_minus_1) & 0x3f) & 1) != 0;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
              ,0x73b,"");
}

Assistant:

static bool compute_mul_parity(carrier_uint two_f,
                                 const cache_entry_type& cache,
                                 int beta_minus_1) FMT_NOEXCEPT {
    FMT_ASSERT(beta_minus_1 >= 1, "");
    FMT_ASSERT(beta_minus_1 < 64, "");

    return ((umul96_lower64(two_f, cache) >> (64 - beta_minus_1)) & 1) != 0;
  }